

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ckh.c
# Opt level: O2

_Bool duckdb_je_ckh_insert(tsd_t *tsd,ckh_t *ckh,void *key,void *data)

{
  long *plVar1;
  rtree_ctx_t *prVar2;
  uint uVar3;
  void *pvVar4;
  rtree_ctx_t *rtree_ctx;
  long lVar5;
  uint uVar6;
  _Bool _Var7;
  _Bool _Var8;
  uint uVar9;
  ulong uVar10;
  arena_t *paVar11;
  rtree_ctx_t *rtree_ctx_00;
  byte bVar12;
  atomic_p_t *paVar13;
  ulong uVar14;
  size_t usize;
  rtree_t *prVar15;
  uintptr_t key_00;
  rtree_metadata_t rVar16;
  void *data_local;
  void *key_local;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  
  prVar2 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  data_local = data;
  key_local = key;
LAB_01e9d0a5:
  paVar11 = (arena_t *)&key_local;
  _Var7 = ckh_try_insert(ckh,(void **)paVar11,&data_local);
  if (!_Var7) {
    return _Var7;
  }
  uVar3 = ckh->lg_curbuckets;
  uVar6 = uVar3;
  do {
    uVar6 = uVar6 + 1;
    bVar12 = (char)uVar6 + 2;
    uVar10 = 0x10L << (bVar12 & 0x3f);
    if (uVar10 < 0x3801) {
      uVar9 = (int)uVar10 + 0x3fU & 0x7fc0;
      if (uVar9 < 0x1001) {
        usize = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar9 >> 3]];
      }
      else {
        uVar10 = (ulong)uVar9 * 2 - 1;
        lVar5 = 0x3f;
        if (uVar10 != 0) {
          for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
          }
        }
        uVar10 = -1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f);
        usize = ~uVar10 + (ulong)uVar9 & uVar10;
      }
      uVar14 = 0x4000;
      if (0x3fff < usize) goto LAB_01e9d16d;
    }
    else {
      uVar14 = 0x4000;
      if (0x4000 < uVar10) {
        if (uVar10 < 0x7000000000000001) {
          uVar14 = (0x20L << (bVar12 & 0x3f)) - 1;
          lVar5 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar5 == 0; lVar5 = lVar5 + -1) {
            }
          }
          paVar11 = (arena_t *)(-1L << (0x3c - ((byte)lVar5 ^ 0x3f) & 0x3f));
          uVar14 = ~(ulong)paVar11 + uVar10 & (ulong)paVar11;
        }
        else {
          uVar14 = 0;
        }
        if (uVar14 < uVar10) {
          return _Var7;
        }
      }
LAB_01e9d16d:
      usize = uVar14;
      if (CARRY8(duckdb_je_sz_large_pad,uVar14)) {
        usize = 0;
      }
    }
    if (usize + 0x8fffffffffffffff < 0x9000000000000000) {
      return _Var7;
    }
    paVar11 = arena_ichoose(tsd,paVar11);
    key_00 = 1;
    rtree_ctx_00 = (rtree_ctx_t *)
                   duckdb_je_arena_palloc
                             ((tsdn_t *)tsd,paVar11,usize,0x40,true,usize < 0x3801,(tcache_t *)0x0);
    if (rtree_ctx_00 == (rtree_ctx_t *)0x0) {
      return _Var7;
    }
    prVar15 = (rtree_t *)prVar2;
    if (tsd == (tsd_t *)0x0) {
      prVar15 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar15);
    }
    rtree_read(&local_1c8,(tsdn_t *)tsd,prVar15,rtree_ctx_00,key_00);
    paVar13 = duckdb_je_arenas;
    pvVar4 = duckdb_je_arenas[(uint)(local_1c8.edata)->e_bits & 0xfff].repr;
    prVar15 = (rtree_t *)prVar2;
    if (tsd == (tsd_t *)0x0) {
      prVar15 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar15);
    }
    rVar16 = rtree_metadata_read((tsdn_t *)tsd,prVar15,rtree_ctx_00,(uintptr_t)paVar13);
    LOCK();
    plVar1 = (long *)((long)pvVar4 + 0x48);
    *plVar1 = *plVar1 + duckdb_je_sz_index2size_tab[rVar16.szind];
    UNLOCK();
    rtree_ctx = (rtree_ctx_t *)ckh->tab;
    ckh->tab = (ckhc_t *)rtree_ctx_00;
    ckh->lg_curbuckets = uVar6;
    _Var8 = ckh_rebuild(ckh,(ckhc_t *)rtree_ctx);
    if (!_Var8) break;
    paVar11 = (arena_t *)ckh->tab;
    prVar15 = (rtree_t *)prVar2;
    if (tsd == (tsd_t *)0x0) {
      prVar15 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar15);
    }
    rtree_read(&local_1c8,(tsdn_t *)tsd,prVar15,(rtree_ctx_t *)paVar11,key_00);
    paVar13 = duckdb_je_arenas;
    pvVar4 = duckdb_je_arenas[(uint)(local_1c8.edata)->e_bits & 0xfff].repr;
    prVar15 = (rtree_t *)prVar2;
    if (tsd == (tsd_t *)0x0) {
      prVar15 = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar15);
    }
    rVar16 = rtree_metadata_read((tsdn_t *)tsd,prVar15,(rtree_ctx_t *)paVar11,(uintptr_t)paVar13);
    LOCK();
    plVar1 = (long *)((long)pvVar4 + 0x48);
    *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar16.szind];
    UNLOCK();
    arena_dalloc_no_tcache((tsdn_t *)tsd,paVar11);
    ckh->tab = (ckhc_t *)rtree_ctx;
    ckh->lg_curbuckets = uVar3;
  } while( true );
  prVar15 = (rtree_t *)prVar2;
  if (tsd == (tsd_t *)0x0) {
    prVar15 = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar15);
  }
  rtree_read(&local_1c8,(tsdn_t *)tsd,prVar15,rtree_ctx,key_00);
  paVar13 = duckdb_je_arenas;
  pvVar4 = duckdb_je_arenas[(uint)(local_1c8.edata)->e_bits & 0xfff].repr;
  prVar15 = (rtree_t *)prVar2;
  if (tsd == (tsd_t *)0x0) {
    prVar15 = (rtree_t *)&rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)prVar15);
  }
  rVar16 = rtree_metadata_read((tsdn_t *)tsd,prVar15,rtree_ctx,(uintptr_t)paVar13);
  LOCK();
  plVar1 = (long *)((long)pvVar4 + 0x48);
  *plVar1 = *plVar1 - duckdb_je_sz_index2size_tab[rVar16.szind];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd,rtree_ctx);
  goto LAB_01e9d0a5;
}

Assistant:

bool
ckh_insert(tsd_t *tsd, ckh_t *ckh, const void *key, const void *data) {
	bool ret;

	assert(ckh != NULL);
	assert(ckh_search(ckh, key, NULL, NULL));

#ifdef CKH_COUNT
	ckh->ninserts++;
#endif

	while (ckh_try_insert(ckh, &key, &data)) {
		if (ckh_grow(tsd, ckh)) {
			ret = true;
			goto label_return;
		}
	}

	ret = false;
label_return:
	return ret;
}